

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::Reflection::ListFields
          (Reflection *this,Message *message,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *output)

{
  pointer *pppFVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  pointer ppFVar6;
  FieldDescriptor *pFVar7;
  FieldDescriptor *pFVar8;
  bool bVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  iterator __position;
  pointer ppFVar13;
  long lVar14;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  __i;
  pointer ppFVar15;
  FieldDescriptor *field;
  FieldDescriptor *local_48;
  uint32 *local_40;
  long local_38;
  
  ppFVar13 = (output->
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  if ((output->
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppFVar13) {
    (output->
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    )._M_impl.super__Vector_impl_data._M_finish = ppFVar13;
  }
  if ((this->schema_).default_instance_ != message) {
    uVar2 = (this->schema_).has_bits_offset_;
    local_38 = 0;
    if ((ulong)uVar2 != 0xffffffff) {
      local_38 = (long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2;
    }
    local_40 = (this->schema_).has_bit_indices_;
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::reserve(output,(long)*(int *)(this->descriptor_ + 0x68));
    if (-1 < this->last_non_weak_field_index_) {
      lVar14 = -1;
      lVar12 = 0;
      do {
        lVar4 = *(long *)(this->descriptor_ + 0x28);
        local_48 = (FieldDescriptor *)(lVar4 + lVar12);
        if (*(int *)(lVar4 + 0x3c + lVar12) == 3) {
          iVar10 = FieldSize(this,message,local_48);
          if (0 < iVar10) {
LAB_00297d96:
            __position._M_current =
                 (output->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (output->
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
LAB_00297e10:
              std::
              vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
              ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                        ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                          *)output,__position,&local_48);
            }
            else {
              *__position._M_current = local_48;
LAB_00297e09:
              pppFVar1 = &(output->
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
              *pppFVar1 = *pppFVar1 + 1;
            }
          }
        }
        else {
          lVar5 = *(long *)(lVar4 + 0x58 + lVar12);
          if (lVar5 == 0) {
            if (uVar2 == 0xffffffff) {
              bVar9 = HasBit(this,message,local_48);
              if (bVar9) goto LAB_00297d96;
            }
            else if ((*(uint *)(local_38 + (ulong)(local_40[lVar14 + 1] >> 5) * 4) >>
                      (local_40[lVar14 + 1] & 0x1f) & 1) != 0) goto LAB_00297dfc;
          }
          else if (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                           (long)((int)((ulong)(lVar5 - *(long *)(*(long *)(lVar5 + 0x10) + 0x30))
                                       >> 4) * -0x55555555) * 4 +
                           (ulong)(uint)(this->schema_).oneof_case_offset_) ==
                   *(int *)(lVar4 + 0x44 + lVar12)) {
LAB_00297dfc:
            __position._M_current =
                 (output->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (output->
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00297e10;
            *__position._M_current = local_48;
            goto LAB_00297e09;
          }
        }
        lVar14 = lVar14 + 1;
        lVar12 = lVar12 + 0x98;
      } while (lVar14 < this->last_non_weak_field_index_);
    }
    if ((this->schema_).extensions_offset_ != -1) {
      internal::ExtensionSet::AppendToList
                ((ExtensionSet *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite +
                 (ulong)(uint)(this->schema_).extensions_offset_),this->descriptor_,
                 this->descriptor_pool_,output);
    }
    ppFVar13 = (output->
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    ppFVar6 = (output->
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar13 != ppFVar6) {
      uVar11 = (long)ppFVar6 - (long)ppFVar13 >> 3;
      lVar12 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar12 == 0; lVar12 = lVar12 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldNumberSorter>>
                (ppFVar13,ppFVar6,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)ppFVar6 - (long)ppFVar13 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldNumberSorter>>
                  (ppFVar13,ppFVar6);
      }
      else {
        ppFVar15 = ppFVar13 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldNumberSorter>>
                  (ppFVar13,ppFVar15);
        for (; ppFVar15 != ppFVar6; ppFVar15 = ppFVar15 + 1) {
          pFVar7 = ppFVar15[-1];
          pFVar8 = *ppFVar15;
          iVar3 = *(int *)(pFVar8 + 0x44);
          iVar10 = *(int *)(pFVar7 + 0x44);
          ppFVar13 = ppFVar15;
          while (iVar3 < iVar10) {
            *ppFVar13 = pFVar7;
            pFVar7 = ppFVar13[-2];
            ppFVar13 = ppFVar13 + -1;
            iVar10 = *(int *)(pFVar7 + 0x44);
          }
          *ppFVar13 = pFVar8;
        }
      }
    }
  }
  return;
}

Assistant:

void Reflection::ListFields(const Message& message,
                            std::vector<const FieldDescriptor*>* output) const {
  output->clear();

  // Optimization:  The default instance never has any fields set.
  if (schema_.IsDefaultInstance(message)) return;

  // Optimization: Avoid calling GetHasBits() and HasOneofField() many times
  // within the field loop.  We allow this violation of ReflectionSchema
  // encapsulation because this function takes a noticable about of CPU
  // fleetwide and properly allowing this optimization through public interfaces
  // seems more trouble than it is worth.
  const uint32* const has_bits =
      schema_.HasHasbits() ? GetHasBits(message) : nullptr;
  const uint32* const has_bits_indices = schema_.has_bit_indices_;
  output->reserve(descriptor_->field_count());
  for (int i = 0; i <= last_non_weak_field_index_; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->is_repeated()) {
      if (FieldSize(message, field) > 0) {
        output->push_back(field);
      }
    } else {
      const OneofDescriptor* containing_oneof = field->containing_oneof();
      if (containing_oneof) {
        const uint32* const oneof_case_array = GetConstPointerAtOffset<uint32>(
            &message, schema_.oneof_case_offset_);
        // Equivalent to: HasOneofField(message, field)
        if (oneof_case_array[containing_oneof->index()] == field->number()) {
          output->push_back(field);
        }
      } else if (has_bits) {
        // Equivalent to: HasBit(message, field)
        if (IsIndexInHasBitSet(has_bits, has_bits_indices[i])) {
          output->push_back(field);
        }
      } else if (HasBit(message, field)) {  // Fall back on proto3-style HasBit.
        output->push_back(field);
      }
    }
  }
  if (schema_.HasExtensionSet()) {
    GetExtensionSet(message).AppendToList(descriptor_, descriptor_pool_,
                                          output);
  }

  // ListFields() must sort output by field number.
  std::sort(output->begin(), output->end(), FieldNumberSorter());
}